

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int ERKStepEvolve(void *arkode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  long lVar1;
  int *nflagPtr;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  realtype rVar10;
  double dVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int iStack_5c;
  realtype rStack_58;
  long lStack_50;
  realtype rStack_48;
  int aiStack_40 [4];
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ERKStep","ERKStepEvolve",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    pcVar9 = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x250) == 0) {
      pcVar9 = "Attempt to call before ARKodeInit.";
      iVar3 = -0x17;
      goto LAB_004b544e;
    }
    *(N_Vector *)((long)arkode_mem + 0x108) = yout;
    if (yout == (N_Vector)0x0) {
      pcVar9 = "yout = NULL illegal.";
    }
    else if (tret == (realtype *)0x0) {
      pcVar9 = "tret = NULL illegal.";
    }
    else {
      if (0xfffffffd < itask - 3U) {
        lVar8 = *(long *)((long)arkode_mem + 0x280);
        if (lVar8 != 0) {
          if (itask == 1) {
            *(realtype *)(lVar8 + 0x50) = tout;
          }
          *(int *)(lVar8 + 0x60) = itask;
        }
        iVar3 = iStack_5c;
        rStack_58 = tout;
        if (*(int *)((long)arkode_mem + 0x254) != 0) {
          rVar10 = *(realtype *)((long)arkode_mem + 0x198);
          *tret = rVar10;
          *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
          iVar3 = arkInitialSetup((ARKodeMem)arkode_mem,tout);
          if (iVar3 != 0) {
            return iVar3;
          }
          iStack_5c = 0;
          iVar3 = 0;
          if (*(int *)((long)arkode_mem + 0x254) != 0) goto LAB_004b54f7;
        }
        iStack_5c = iVar3;
        iVar3 = arkStopTests((ARKodeMem)arkode_mem,rStack_58,yout,tret,itask,&iStack_5c);
        if (iVar3 != 0) {
          return iStack_5c;
        }
LAB_004b54f7:
        nflagPtr = aiStack_40 + 3;
        lVar8 = 0;
        do {
          *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x168);
          lStack_50 = lVar8;
          if (*(int *)((long)arkode_mem + 0x254) == 0) {
            iVar3 = (**(code **)((long)arkode_mem + 0x58))
                              (*(undefined8 *)((long)arkode_mem + 0x110),
                               *(undefined8 *)((long)arkode_mem + 0xf0),
                               *(undefined8 *)((long)arkode_mem + 0x60));
            if (iVar3 == 0) {
              if ((*(int *)((long)arkode_mem + 0x100) != 0) ||
                 (iVar3 = (**(code **)((long)arkode_mem + 0x70))
                                    (*(undefined8 *)((long)arkode_mem + 0x110),
                                     *(undefined8 *)((long)arkode_mem + 0xf8),
                                     *(undefined8 *)((long)arkode_mem + 0x78)), iVar3 == 0))
              goto LAB_004b556c;
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar12 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar5 = "At t = %lg, the user-provide RwtSet function failed.";
              pcVar9 = "At t = %lg, a component of rwt has become <= 0.";
            }
            else {
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar12 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar5 = "At t = %lg, the user-provide EwtSet function failed.";
              pcVar9 = "At t = %lg, a component of ewt has become <= 0.";
            }
            if (iVar3 == 2) {
              pcVar9 = pcVar5;
            }
            iVar3 = -0x16;
LAB_004b5c39:
            arkProcessError((ARKodeMem)arkode_mem,iVar3,"ARKode","arkEvolve",pcVar9,uVar12);
LAB_004b5a67:
            rVar10 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar10;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            return iVar3;
          }
LAB_004b556c:
          if (*(long *)((long)arkode_mem + 0x1b8) <= lStack_50 &&
              0 < *(long *)((long)arkode_mem + 0x1b8)) {
            uVar12 = *(undefined8 *)((long)arkode_mem + 0x198);
            pcVar9 = "At t = %lg, mxstep steps taken before reaching tout.";
            iVar3 = -1;
            goto LAB_004b5c39;
          }
          rVar10 = N_VWrmsNorm(*(N_Vector *)((long)arkode_mem + 0x110),
                               *(N_Vector *)((long)arkode_mem + 0xf0));
          dVar11 = rVar10 * *(double *)((long)arkode_mem + 8);
          *(double *)((long)arkode_mem + 0x240) = dVar11;
          if (1.0 < dVar11) {
            arkProcessError((ARKodeMem)arkode_mem,-2,"ARKode","arkEvolve",
                            "At t = %lg, too much accuracy requested.",
                            *(undefined8 *)((long)arkode_mem + 0x198));
            rVar10 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar10;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(double *)((long)arkode_mem + 0x240) =
                 *(double *)((long)arkode_mem + 0x240) + *(double *)((long)arkode_mem + 0x240);
            return -2;
          }
          *(undefined8 *)((long)arkode_mem + 0x240) = 0x3ff0000000000000;
          dVar11 = *(double *)((long)arkode_mem + 0x198);
          dVar13 = dVar11 + *(double *)((long)arkode_mem + 0x168);
          if ((dVar13 == dVar11) && (!NAN(dVar13) && !NAN(dVar11))) {
            iVar4 = *(int *)((long)arkode_mem + 0x1c0);
            iVar2 = *(int *)((long)arkode_mem + 0x1e0);
            iVar3 = iVar2 + 1;
            *(int *)((long)arkode_mem + 0x1e0) = iVar3;
            if (iVar2 < iVar4) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                             );
              iVar4 = *(int *)((long)arkode_mem + 0x1c0);
              iVar3 = *(int *)((long)arkode_mem + 0x1e0);
            }
            if (iVar3 == iVar4) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          dVar11 = *(double *)((long)arkode_mem + 0x168);
          if ((*(double *)((long)arkode_mem + 0x180) != dVar11) ||
             (NAN(*(double *)((long)arkode_mem + 0x180)) || NAN(dVar11))) {
            dVar11 = dVar11 * *(double *)((long)arkode_mem + 400);
            *(double *)((long)arkode_mem + 0x168) = dVar11;
            *(double *)((long)arkode_mem + 0x188) = dVar11;
          }
          if (*(int *)((long)arkode_mem + 0x1a8) != 0) {
            dVar11 = *(double *)((long)arkode_mem + 0x160);
            *(double *)((long)arkode_mem + 0x168) = dVar11;
            *(double *)((long)arkode_mem + 0x188) = dVar11;
            if (*(int *)((long)arkode_mem + 0x150) != 0) {
              if (0.0 < ((dVar11 + *(double *)((long)arkode_mem + 0x198)) -
                        *(double *)((long)arkode_mem + 0x158)) * dVar11) {
                *(double *)((long)arkode_mem + 0x168) =
                     (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
                     (*(double *)((long)arkode_mem + 0x158) - *(double *)((long)arkode_mem + 0x198))
                ;
              }
            }
          }
          rStack_48 = 0.0;
          *(undefined4 *)((long)arkode_mem + 0x2a4) = 0;
          aiStack_40[0] = 0;
          aiStack_40[1] = 0;
          aiStack_40[2] = 0;
          aiStack_40[3] = 6;
          while( true ) {
            *(long *)((long)arkode_mem + 0x1d0) = *(long *)((long)arkode_mem + 0x1d0) + 1;
            iVar3 = (**(code **)((long)arkode_mem + 0xe0))(arkode_mem,&rStack_48,nflagPtr);
            if (iVar3 < 0) goto LAB_004b5a5b;
            iVar3 = arkCheckConvergence((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 2);
            if ((iVar3 < 0) ||
               (((iVar3 == 0 && (*(int *)((long)arkode_mem + 0x80) != 0)) &&
                (iVar3 = arkCheckConstraints((ARKodeMem)arkode_mem,aiStack_40,nflagPtr), iVar3 < 0))
               )) goto LAB_004b5a5b;
            if (*(int *)((long)arkode_mem + 0x1a8) != 0) break;
            if ((iVar3 == 0) &&
               (iVar3 = arkCheckTemporalError
                                  ((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 1,rStack_48),
               iVar3 < 0)) goto LAB_004b5a5b;
            dVar11 = *(double *)((long)arkode_mem + 400);
            if (**(double **)((long)arkode_mem + 0x1b0) <= *(double *)((long)arkode_mem + 400)) {
              dVar11 = **(double **)((long)arkode_mem + 0x1b0);
            }
            dVar13 = ABS(*(double *)((long)arkode_mem + 0x168));
            dVar14 = *(double *)((long)arkode_mem + 0x170) / dVar13;
            if (dVar11 <= dVar14) {
              dVar11 = dVar14;
            }
            dVar15 = *(double *)((long)arkode_mem + 0x178) * dVar13 * dVar11;
            dVar14 = 1.0;
            if (1.0 <= dVar15) {
              dVar14 = dVar15;
            }
            *(double *)((long)arkode_mem + 400) = dVar11 / dVar14;
            if (*(int *)((long)arkode_mem + 0x2a0) != 0) {
              *(int *)((long)arkode_mem + 0x2a4) = iVar3;
              goto LAB_004b586d;
            }
            if (iVar3 == 0) goto LAB_004b586d;
            if (dVar13 <= *(double *)((long)arkode_mem + 0x170) * 1.000001) {
              return -3;
            }
            dVar11 = *(double *)((long)arkode_mem + 0x168) * (dVar11 / dVar14);
            *(double *)((long)arkode_mem + 0x168) = dVar11;
            *(double *)((long)arkode_mem + 0x180) = dVar11;
            *(double *)((long)arkode_mem + 0x188) = dVar11;
          }
          *(undefined8 *)((long)arkode_mem + 400) = 0x3ff0000000000000;
          if (iVar3 != 0) goto LAB_004b5a5b;
LAB_004b586d:
          iVar3 = arkCompleteStep((ARKodeMem)arkode_mem,rStack_48);
          if (iVar3 != 0) {
LAB_004b5a5b:
            iVar3 = arkHandleFailure((ARKodeMem)arkode_mem,iVar3);
            goto LAB_004b5a67;
          }
          if ((*(long *)((long)arkode_mem + 0x280) != 0) &&
             (0 < *(int *)(*(long *)((long)arkode_mem + 0x280) + 8))) {
            iVar3 = arkRootCheck3(arkode_mem);
            if (iVar3 == -0xc) {
              arkProcessError((ARKodeMem)arkode_mem,-0xc,"ARKode","arkEvolve",
                              "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                              ,*(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x20));
              return -0xc;
            }
            if (iVar3 == 1) {
              lVar8 = *(long *)((long)arkode_mem + 0x280);
              *(undefined4 *)(lVar8 + 100) = 1;
              rVar10 = *(realtype *)(lVar8 + 0x20);
              *tret = rVar10;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
              return 2;
            }
            if (*(long *)((long)arkode_mem + 0x1d8) == 1) {
              lVar8 = *(long *)((long)arkode_mem + 0x280);
              uVar6 = (ulong)*(uint *)(lVar8 + 8);
              if ((int)*(uint *)(lVar8 + 8) < 1) {
                uVar6 = 0;
              }
              uVar7 = 0;
              do {
                if (uVar6 == uVar7) goto LAB_004b5924;
                lVar1 = uVar7 * 4;
                uVar7 = uVar7 + 1;
              } while (*(int *)(*(long *)(lVar8 + 0x70) + lVar1) != 0);
              if (0 < *(int *)(lVar8 + 0x78)) {
                arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
            }
          }
LAB_004b5924:
          if ((itask == 1) &&
             (0.0 <= (*(double *)((long)arkode_mem + 0x198) - rStack_58) *
                     *(double *)((long)arkode_mem + 0x168))) {
            *tret = rStack_58;
            *(realtype *)((long)arkode_mem + 0x1a0) = rStack_58;
            arkGetDky((ARKodeMem)arkode_mem,rStack_58,0,yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
          if (*(int *)((long)arkode_mem + 0x150) != 0) {
            dVar11 = *(double *)((long)arkode_mem + 0x158);
            dVar13 = *(double *)((long)arkode_mem + 0x198);
            dVar14 = *(double *)((long)arkode_mem + 0x168);
            if (ABS(dVar13 - dVar11) <=
                (ABS(dVar14) + ABS(dVar13)) * *(double *)((long)arkode_mem + 8) * 100.0) {
              arkGetDky((ARKodeMem)arkode_mem,dVar11,0,yout);
              rVar10 = *(realtype *)((long)arkode_mem + 0x158);
              *tret = rVar10;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
              *(undefined4 *)((long)arkode_mem + 0x150) = 0;
              return 1;
            }
            if (0.0 < ((*(double *)((long)arkode_mem + 0x180) + dVar13) - dVar11) * dVar14) {
              dVar11 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) * (dVar11 - dVar13);
              *(double *)((long)arkode_mem + 0x180) = dVar11;
              *(double *)((long)arkode_mem + 400) = dVar11 / dVar14;
            }
          }
          lVar8 = lStack_50 + 1;
          if (itask == 2) {
            rVar10 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar10;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar10;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
        } while( true );
      }
      pcVar9 = "Illegal value for itask.";
    }
    iVar3 = -0x16;
  }
LAB_004b544e:
  arkProcessError((ARKodeMem)arkode_mem,iVar3,"ARKode","arkEvolve",pcVar9);
  return iVar3;
}

Assistant:

int ERKStepEvolve(void *arkode_mem, realtype tout, N_Vector yout,
                  realtype *tret, int itask)
{
  /* unpack ark_mem, call arkEvolve, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepEvolve", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkEvolve(ark_mem, tout, yout, tret, itask);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}